

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intensity_aperture_solver.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  string *psVar4;
  pointer pcVar5;
  pointer pcVar6;
  pointer pcVar7;
  pointer pcVar8;
  char *pcVar9;
  char **argv_00;
  char cVar10;
  char cVar11;
  char cVar12;
  long *plVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  Station *this;
  EvaluationFunction *ev;
  size_type *psVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  int i;
  int iVar21;
  value_type *__val;
  undefined4 uVar22;
  undefined4 uVar23;
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  initializer_list<args::EitherFlag> in_02;
  initializer_list<args::EitherFlag> in_03;
  initializer_list<args::EitherFlag> in_04;
  initializer_list<args::EitherFlag> in_05;
  initializer_list<args::EitherFlag> in_06;
  initializer_list<args::EitherFlag> in_07;
  initializer_list<args::EitherFlag> in_08;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  coord_files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  organ_files;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> volumes;
  IntensityILS ils;
  vector<double,_std::allocator<double>_> w;
  Collimator collimator;
  ValueFlag<double,_args::ValueReader<double>_> _alpha;
  Plan P;
  ValueFlag<double,_args::ValueReader<double>_> _beta;
  vector<double,_std::allocator<double>_> Zmax;
  vector<double,_std::allocator<double>_> Zmin;
  ValueFlag<int,_args::ValueReader<int>_> _maxiter;
  ValueFlag<int,_args::ValueReader<int>_> _maxdelta;
  ValueFlag<int,_args::ValueReader<int>_> _max_apertures;
  ValueFlag<int,_args::ValueReader<int>_> _maxratio;
  ValueFlag<int,_args::ValueReader<int>_> _int0;
  ValueFlag<int,_args::ValueReader<int>_> _vsize;
  ValueFlag<int,_args::ValueReader<int>_> _bsize;
  ArgumentParser parser;
  HelpFlag help;
  int local_e2c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e08;
  char **local_de0;
  int local_dd4;
  int local_dd0;
  int local_dcc;
  undefined1 local_dc8 [40];
  undefined8 local_da0;
  double local_d98;
  double local_d90;
  undefined1 local_d88 [24];
  int iStack_d70;
  int iStack_d6c;
  int local_d68;
  undefined8 local_d64;
  double local_d58;
  undefined8 local_d50;
  double local_d48;
  undefined8 local_d40;
  undefined8 local_d38;
  double local_d30;
  double local_d28;
  vector<double,_std::allocator<double>_> local_d20;
  undefined1 local_d08 [440];
  undefined1 local_b50 [16];
  undefined1 local_b40 [32];
  _Alloc_hider local_b20 [2];
  char local_b10 [152];
  undefined1 local_a78 [8];
  _Alloc_hider _Stack_a70;
  undefined1 local_a68 [192];
  undefined1 local_9a8 [16];
  char local_998 [8];
  char local_990 [176];
  double local_8e0;
  vector<double,_std::allocator<double>_> local_8d0;
  vector<double,_std::allocator<double>_> local_8b8;
  vector<double,_std::allocator<double>_> local_8a0;
  vector<double,_std::allocator<double>_> local_888;
  vector<double,_std::allocator<double>_> local_870;
  undefined1 local_858 [16];
  undefined1 local_848 [184];
  int local_790;
  string local_788;
  undefined1 local_768 [200];
  int local_6a0;
  undefined1 local_698 [200];
  int local_5d0;
  undefined1 local_5c8 [200];
  int local_500;
  undefined1 local_4f8 [200];
  int local_430;
  undefined1 local_428 [200];
  int local_360;
  ValueFlag<int,_args::ValueReader<int>_> local_358;
  ArgumentParser local_288;
  FlagBase local_f8;
  
  pcVar3 = local_d08 + 0x10;
  local_d08._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d08,"********* IMRT-Solver (Intensity-aperture solver) *********","");
  local_b50._0_8_ = local_b40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b50,
             "Example:\n./IAS --max_iter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --max_ap=4"
             ,"");
  args::ArgumentParser::ArgumentParser(&local_288,(string *)local_d08,(string *)local_b50);
  if ((undefined1 *)local_b50._0_8_ != local_b40) {
    operator_delete((void *)local_b50._0_8_);
  }
  if ((pointer)local_d08._0_8_ != pcVar3) {
    operator_delete((void *)local_d08._0_8_);
  }
  local_9a8._0_8_ = local_998;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9a8,"help","");
  psVar4 = &local_358.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.help;
  local_358.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"Display this help menu","");
  pcVar5 = local_b40 + 8;
  local_b50._0_2_ = 0x6801;
  local_b40._0_8_ = 0;
  local_b40[8] = '\0';
  local_b40._24_2_ = 0;
  local_b20[0]._M_p = local_b10;
  local_b50._8_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b20,"help","");
  in._M_len = 2;
  in._M_array = (iterator)local_b50;
  args::Matcher::Matcher((Matcher *)local_d08,in);
  local_de0 = argv;
  args::Flag::Flag((Flag *)&local_f8,&local_288.super_Group,(string *)local_9a8,(string *)&local_358
                   ,(Matcher *)local_d08,false);
  local_f8.super_NamedBase.super_Base._vptr_Base = (_func_int **)&PTR__FlagBase_0012f920;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(local_d08 + 0x38));
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_d08);
  lVar19 = 0;
  do {
    pcVar9 = *(char **)((long)&local_b20[0]._M_p + lVar19);
    if (local_b10 + lVar19 != pcVar9) {
      operator_delete(pcVar9);
    }
    lVar19 = lVar19 + -0x28;
  } while (lVar19 != -0x50);
  if ((string *)local_358.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base._vptr_Base
      != psVar4) {
    operator_delete(local_358.super_ValueFlagBase.super_FlagBase.super_NamedBase.super_Base.
                    _vptr_Base);
  }
  if ((char *)local_9a8._0_8_ != local_998) {
    operator_delete((void *)local_9a8._0_8_);
  }
  local_9a8._0_8_ = local_998;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9a8,"int","");
  pcVar6 = local_698 + 0x10;
  local_698._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct((ulong)local_698,'\x01');
  *(char *)local_698._0_8_ = '5';
  plVar13 = (long *)std::__cxx11::string::replace((ulong)local_698,0,(char *)0x0,0x12311e);
  pcVar7 = local_4f8 + 0x10;
  psVar16 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar16) {
    local_4f8._16_8_ = *psVar16;
    local_4f8._24_8_ = plVar13[3];
    local_4f8._0_8_ = pcVar7;
  }
  else {
    local_4f8._16_8_ = *psVar16;
    local_4f8._0_8_ = (size_type *)*plVar13;
  }
  local_4f8._8_8_ = plVar13[1];
  *plVar13 = (long)psVar16;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append(local_4f8);
  psVar16 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar16) {
    local_428._16_8_ = *psVar16;
    local_428._24_4_ = (undefined4)plVar13[3];
    local_428._28_4_ = *(undefined4 *)((long)plVar13 + 0x1c);
    local_428._0_8_ = local_428 + 0x10;
  }
  else {
    local_428._16_8_ = *psVar16;
    local_428._0_8_ = (size_type *)*plVar13;
  }
  local_428._8_8_ = plVar13[1];
  *plVar13 = (long)psVar16;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  local_b50._0_8_ = local_b50._0_8_ & 0xffffffffffff0000;
  local_b50._8_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b50 + 8),"bsize","");
  in_00._M_len = 1;
  in_00._M_array = (iterator)local_b50;
  args::Matcher::Matcher((Matcher *)local_d08,in_00);
  local_768._0_8_ = (ulong)(uint)local_768._4_4_ << 0x20;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            (&local_358,&local_288.super_Group,(string *)local_9a8,(string *)local_428,
             (Matcher *)local_d08,(int *)local_768,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(local_d08 + 0x38));
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_d08);
  if ((pointer)local_b50._8_8_ != pcVar5) {
    operator_delete((void *)local_b50._8_8_);
  }
  if ((undefined1 *)local_428._0_8_ != local_428 + 0x10) {
    operator_delete((void *)local_428._0_8_);
  }
  if ((pointer)local_4f8._0_8_ != pcVar7) {
    operator_delete((void *)local_4f8._0_8_);
  }
  if ((pointer)local_698._0_8_ != pcVar6) {
    operator_delete((void *)local_698._0_8_);
  }
  if ((char *)local_9a8._0_8_ != local_998) {
    operator_delete((void *)local_9a8._0_8_);
  }
  local_9a8._0_8_ = local_998;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9a8,"int","");
  pcVar8 = local_768 + 0x10;
  local_768._0_8_ = pcVar8;
  std::__cxx11::string::_M_construct((ulong)local_768,'\x02');
  *(undefined2 *)local_768._0_8_ = 0x3032;
  puVar14 = (undefined8 *)std::__cxx11::string::replace((ulong)local_768,0,(char *)0x0,0x123152);
  psVar16 = puVar14 + 2;
  if ((size_type *)*puVar14 == psVar16) {
    local_698._16_8_ = *psVar16;
    local_698._24_8_ = puVar14[3];
    local_698._0_8_ = pcVar6;
  }
  else {
    local_698._16_8_ = *psVar16;
    local_698._0_8_ = (size_type *)*puVar14;
  }
  local_698._8_8_ = puVar14[1];
  *puVar14 = psVar16;
  puVar14[1] = 0;
  *(undefined1 *)(puVar14 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append(local_698);
  psVar16 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar16) {
    local_4f8._16_8_ = *psVar16;
    local_4f8._24_8_ = plVar13[3];
    local_4f8._0_8_ = pcVar7;
  }
  else {
    local_4f8._16_8_ = *psVar16;
    local_4f8._0_8_ = (size_type *)*plVar13;
  }
  local_4f8._8_8_ = plVar13[1];
  *plVar13 = (long)psVar16;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  local_b50._0_8_ = local_b50._0_8_ & 0xffffffffffff0000;
  local_b50._8_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b50 + 8),"vsize","");
  in_01._M_len = 1;
  in_01._M_array = (iterator)local_b50;
  args::Matcher::Matcher((Matcher *)local_d08,in_01);
  local_5c8._0_8_ = (ulong)(uint)local_5c8._4_4_ << 0x20;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)local_428,&local_288.super_Group,
             (string *)local_9a8,(string *)local_4f8,(Matcher *)local_d08,(int *)local_5c8,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(local_d08 + 0x38));
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_d08);
  if ((pointer)local_b50._8_8_ != pcVar5) {
    operator_delete((void *)local_b50._8_8_);
  }
  if ((pointer)local_4f8._0_8_ != pcVar7) {
    operator_delete((void *)local_4f8._0_8_);
  }
  if ((pointer)local_698._0_8_ != pcVar6) {
    operator_delete((void *)local_698._0_8_);
  }
  if ((pointer)local_768._0_8_ != pcVar8) {
    operator_delete((void *)local_768._0_8_);
  }
  if ((char *)local_9a8._0_8_ != local_998) {
    operator_delete((void *)local_9a8._0_8_);
  }
  local_9a8._0_8_ = local_998;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9a8,"int","");
  local_d90 = 4.0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8,
             vsnprintf,0x148,"%f");
  puVar14 = (undefined8 *)std::__cxx11::string::replace((ulong)local_5c8,0,(char *)0x0,0x12317c);
  psVar16 = puVar14 + 2;
  if ((size_type *)*puVar14 == psVar16) {
    local_768._16_8_ = *psVar16;
    local_768._24_8_ = puVar14[3];
    local_768._0_8_ = pcVar8;
  }
  else {
    local_768._16_8_ = *psVar16;
    local_768._0_8_ = (size_type *)*puVar14;
  }
  local_768._8_8_ = puVar14[1];
  *puVar14 = psVar16;
  puVar14[1] = 0;
  *(undefined1 *)(puVar14 + 2) = 0;
  puVar14 = (undefined8 *)std::__cxx11::string::append(local_768);
  psVar16 = puVar14 + 2;
  if ((size_type *)*puVar14 == psVar16) {
    local_698._16_8_ = *psVar16;
    local_698._24_8_ = puVar14[3];
    local_698._0_8_ = pcVar6;
  }
  else {
    local_698._16_8_ = *psVar16;
    local_698._0_8_ = (size_type *)*puVar14;
  }
  local_698._8_8_ = puVar14[1];
  *puVar14 = psVar16;
  puVar14[1] = 0;
  *(undefined1 *)(puVar14 + 2) = 0;
  local_b50._0_8_ = local_b50._0_8_ & 0xffffffffffff0000;
  local_b50._8_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b50 + 8),"int0","");
  in_02._M_len = 1;
  in_02._M_array = (iterator)local_b50;
  args::Matcher::Matcher((Matcher *)local_d08,in_02);
  local_858._0_8_ = (ulong)(uint)local_858._4_4_ << 0x20;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)local_4f8,&local_288.super_Group,
             (string *)local_9a8,(string *)local_698,(Matcher *)local_d08,(int *)local_858,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(local_d08 + 0x38));
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_d08);
  if ((pointer)local_b50._8_8_ != pcVar5) {
    operator_delete((void *)local_b50._8_8_);
  }
  if ((pointer)local_698._0_8_ != pcVar6) {
    operator_delete((void *)local_698._0_8_);
  }
  if ((pointer)local_768._0_8_ != pcVar8) {
    operator_delete((void *)local_768._0_8_);
  }
  pcVar6 = local_5c8 + 0x10;
  if ((pointer)local_5c8._0_8_ != pcVar6) {
    operator_delete((void *)local_5c8._0_8_);
  }
  if ((char *)local_9a8._0_8_ != local_998) {
    operator_delete((void *)local_9a8._0_8_);
  }
  local_9a8._0_8_ = local_998;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9a8,"int","");
  local_858._0_8_ = local_848;
  std::__cxx11::string::_M_construct((ulong)local_858,'\x01');
  *(char *)local_858._0_8_ = '4';
  plVar13 = (long *)std::__cxx11::string::replace((ulong)local_858,0,(char *)0x0,0x1231a0);
  psVar16 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar16) {
    local_5c8._16_8_ = *psVar16;
    local_5c8._24_8_ = plVar13[3];
    local_5c8._0_8_ = pcVar6;
  }
  else {
    local_5c8._16_8_ = *psVar16;
    local_5c8._0_8_ = (size_type *)*plVar13;
  }
  local_5c8._8_8_ = plVar13[1];
  *plVar13 = (long)psVar16;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  puVar14 = (undefined8 *)std::__cxx11::string::append(local_5c8);
  psVar16 = puVar14 + 2;
  if ((size_type *)*puVar14 == psVar16) {
    local_768._16_8_ = *psVar16;
    local_768._24_8_ = puVar14[3];
    local_768._0_8_ = pcVar8;
  }
  else {
    local_768._16_8_ = *psVar16;
    local_768._0_8_ = (size_type *)*puVar14;
  }
  local_768._8_8_ = puVar14[1];
  *puVar14 = psVar16;
  puVar14[1] = 0;
  *(undefined1 *)(puVar14 + 2) = 0;
  local_b50._0_8_ = local_b50._0_8_ & 0xffffffffffff0000;
  local_b50._8_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b50 + 8),"max_ap","");
  in_03._M_len = 1;
  in_03._M_array = (iterator)local_b50;
  args::Matcher::Matcher((Matcher *)local_d08,in_03);
  local_a78 = (undefined1  [8])((ulong)(uint)local_a78._4_4_ << 0x20);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)local_698,&local_288.super_Group,
             (string *)local_9a8,(string *)local_768,(Matcher *)local_d08,(int *)local_a78,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(local_d08 + 0x38));
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_d08);
  if ((pointer)local_b50._8_8_ != pcVar5) {
    operator_delete((void *)local_b50._8_8_);
  }
  if ((pointer)local_768._0_8_ != pcVar8) {
    operator_delete((void *)local_768._0_8_);
  }
  if ((pointer)local_5c8._0_8_ != pcVar6) {
    operator_delete((void *)local_5c8._0_8_);
  }
  if ((undefined1 *)local_858._0_8_ != local_848) {
    operator_delete((void *)local_858._0_8_);
  }
  if ((char *)local_9a8._0_8_ != local_998) {
    operator_delete((void *)local_9a8._0_8_);
  }
  local_9a8._0_8_ = local_998;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9a8,"int","");
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a78,
             vsnprintf,0x148,"%f",0);
  puVar14 = (undefined8 *)std::__cxx11::string::replace((ulong)local_a78,0,(char *)0x0,0x1231cc);
  psVar16 = puVar14 + 2;
  if ((size_type *)*puVar14 == psVar16) {
    local_848._0_8_ = *psVar16;
    local_848._8_8_ = puVar14[3];
    local_858._0_8_ = local_848;
  }
  else {
    local_848._0_8_ = *psVar16;
    local_858._0_8_ = (size_type *)*puVar14;
  }
  local_858._8_8_ = puVar14[1];
  *puVar14 = psVar16;
  puVar14[1] = 0;
  *(undefined1 *)(puVar14 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append(local_858);
  psVar16 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar16) {
    local_5c8._16_8_ = *psVar16;
    local_5c8._24_8_ = plVar13[3];
    local_5c8._0_8_ = pcVar6;
  }
  else {
    local_5c8._16_8_ = *psVar16;
    local_5c8._0_8_ = (size_type *)*plVar13;
  }
  local_5c8._8_8_ = plVar13[1];
  *plVar13 = (long)psVar16;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  local_b50._0_8_ = local_b50._0_8_ & 0xffffffffffff0000;
  local_b50._8_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b50 + 8),"maxdelta","");
  in_04._M_len = 1;
  in_04._M_array = (iterator)local_b50;
  args::Matcher::Matcher((Matcher *)local_d08,in_04);
  local_d88._0_8_ = (ulong)(uint)local_d88._4_4_ << 0x20;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)local_768,&local_288.super_Group,
             (string *)local_9a8,(string *)local_5c8,(Matcher *)local_d08,(int *)local_d88,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(local_d08 + 0x38));
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_d08);
  if ((pointer)local_b50._8_8_ != pcVar5) {
    operator_delete((void *)local_b50._8_8_);
  }
  if ((pointer)local_5c8._0_8_ != pcVar6) {
    operator_delete((void *)local_5c8._0_8_);
  }
  if ((undefined1 *)local_858._0_8_ != local_848) {
    operator_delete((void *)local_858._0_8_);
  }
  if (local_a78 != (undefined1  [8])local_a68) {
    operator_delete((void *)local_a78);
  }
  if ((char *)local_9a8._0_8_ != local_998) {
    operator_delete((void *)local_9a8._0_8_);
  }
  local_9a8._0_8_ = local_998;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9a8,"int","");
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d88,
             vsnprintf,0x148,"%f",0);
  plVar13 = (long *)std::__cxx11::string::replace((ulong)local_d88,0,(char *)0x0,0x1231e2);
  psVar16 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar16) {
    local_a68._0_8_ = *psVar16;
    local_a68._8_8_ = plVar13[3];
    local_a78 = (undefined1  [8])local_a68;
  }
  else {
    local_a68._0_8_ = *psVar16;
    local_a78 = (undefined1  [8])*plVar13;
  }
  _Stack_a70._M_p = (pointer)plVar13[1];
  *plVar13 = (long)psVar16;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  puVar14 = (undefined8 *)std::__cxx11::string::append(local_a78);
  psVar16 = puVar14 + 2;
  if ((size_type *)*puVar14 == psVar16) {
    local_848._0_8_ = *psVar16;
    local_848._8_8_ = puVar14[3];
    local_858._0_8_ = local_848;
  }
  else {
    local_848._0_8_ = *psVar16;
    local_858._0_8_ = (size_type *)*puVar14;
  }
  local_858._8_8_ = puVar14[1];
  *puVar14 = psVar16;
  puVar14[1] = 0;
  *(undefined1 *)(puVar14 + 2) = 0;
  local_b50._0_8_ = local_b50._0_8_ & 0xffffffffffff0000;
  local_b50._8_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_b50 + 8),"maxratio","");
  in_05._M_len = 1;
  in_05._M_array = (iterator)local_b50;
  args::Matcher::Matcher((Matcher *)local_d08,in_05);
  local_e28._M_dataplus._M_p = (pointer)((ulong)local_e28._M_dataplus._M_p._4_4_ << 0x20);
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)local_5c8,&local_288.super_Group,
             (string *)local_9a8,(string *)local_858,(Matcher *)local_d08,(int *)&local_e28,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(local_d08 + 0x38));
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_d08);
  if ((pointer)local_b50._8_8_ != pcVar5) {
    operator_delete((void *)local_b50._8_8_);
  }
  if ((undefined1 *)local_858._0_8_ != local_848) {
    operator_delete((void *)local_858._0_8_);
  }
  if (local_a78 != (undefined1  [8])local_a68) {
    operator_delete((void *)local_a78);
  }
  pcVar5 = local_d88 + 0x10;
  if ((pointer)local_d88._0_8_ != pcVar5) {
    operator_delete((void *)local_d88._0_8_);
  }
  if ((char *)local_9a8._0_8_ != local_998) {
    operator_delete((void *)local_9a8._0_8_);
  }
  local_858._0_8_ = local_848;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_858,"double","");
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_e28,vsnprintf,0x148,"%f",0);
  plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_e28,0,(char *)0x0,0x1231ff);
  psVar16 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar16) {
    local_d88._16_8_ = *psVar16;
    _iStack_d70 = plVar13[3];
    local_d88._0_8_ = pcVar5;
  }
  else {
    local_d88._16_8_ = *psVar16;
    local_d88._0_8_ = (size_type *)*plVar13;
  }
  local_d88._8_8_ = plVar13[1];
  *plVar13 = (long)psVar16;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append(local_d88);
  psVar16 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar16) {
    local_a68._0_8_ = *psVar16;
    local_a68._8_8_ = plVar13[3];
    local_a78 = (undefined1  [8])local_a68;
  }
  else {
    local_a68._0_8_ = *psVar16;
    local_a78 = (undefined1  [8])*plVar13;
  }
  _Stack_a70._M_p = (pointer)plVar13[1];
  *plVar13 = (long)psVar16;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  local_9a8._0_8_ = local_9a8._0_8_ & 0xffffffffffff0000;
  local_9a8._8_8_ = local_990;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_9a8 + 8),"alpha","");
  in_06._M_len = 1;
  in_06._M_array = (iterator)local_9a8;
  args::Matcher::Matcher((Matcher *)local_d08,in_06);
  local_e08._M_dataplus._M_p = (pointer)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            ((ValueFlag<double,_args::ValueReader<double>_> *)local_b50,&local_288.super_Group,
             (string *)local_858,(string *)local_a78,(Matcher *)local_d08,(double *)&local_e08,false
            );
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(local_d08 + 0x38));
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_d08);
  if ((char *)local_9a8._8_8_ != local_990) {
    operator_delete((void *)local_9a8._8_8_);
  }
  if (local_a78 != (undefined1  [8])local_a68) {
    operator_delete((void *)local_a78);
  }
  if ((pointer)local_d88._0_8_ != pcVar5) {
    operator_delete((void *)local_d88._0_8_);
  }
  paVar1 = &local_e28.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e28._M_dataplus._M_p != paVar1) {
    operator_delete(local_e28._M_dataplus._M_p);
  }
  if ((undefined1 *)local_858._0_8_ != local_848) {
    operator_delete((void *)local_858._0_8_);
  }
  local_a78 = (undefined1  [8])local_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"double","");
  local_d98 = 1.0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(&local_e08,vsnprintf,0x148,"%f");
  plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_e08,0,(char *)0x0,0x12322c);
  psVar16 = (size_type *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar16) {
    local_e28.field_2._M_allocated_capacity = *psVar16;
    local_e28.field_2._8_8_ = plVar13[3];
    local_e28._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_e28.field_2._M_allocated_capacity = *psVar16;
    local_e28._M_dataplus._M_p = (pointer)*plVar13;
  }
  local_e28._M_string_length = plVar13[1];
  *plVar13 = (long)psVar16;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_e28);
  psVar16 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar16) {
    local_d88._16_8_ = *psVar16;
    _iStack_d70 = plVar13[3];
    local_d88._0_8_ = pcVar5;
  }
  else {
    local_d88._16_8_ = *psVar16;
    local_d88._0_8_ = (size_type *)*plVar13;
  }
  local_d88._8_8_ = plVar13[1];
  *plVar13 = (long)psVar16;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  local_858._0_8_ = local_858._0_8_ & 0xffffffffffff0000;
  local_858._8_8_ = local_848 + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_858 + 8),"beta","");
  in_07._M_len = 1;
  in_07._M_array = (iterator)local_858;
  args::Matcher::Matcher((Matcher *)local_d08,in_07);
  local_dc8._0_8_ = (pointer)0x0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            ((ValueFlag<double,_args::ValueReader<double>_> *)local_9a8,&local_288.super_Group,
             (string *)local_a78,(string *)local_d88,(Matcher *)local_d08,(double *)local_dc8,false)
  ;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(local_d08 + 0x38));
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_d08);
  if ((undefined1 *)local_858._8_8_ != local_848 + 8) {
    operator_delete((void *)local_858._8_8_);
  }
  if ((pointer)local_d88._0_8_ != pcVar5) {
    operator_delete((void *)local_d88._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e28._M_dataplus._M_p != paVar1) {
    operator_delete(local_e28._M_dataplus._M_p);
  }
  paVar2 = &local_e08.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e08._M_dataplus._M_p != paVar2) {
    operator_delete(local_e08._M_dataplus._M_p);
  }
  if (local_a78 != (undefined1  [8])local_a68) {
    operator_delete((void *)local_a78);
  }
  local_d88._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d88,"int","");
  local_dc8._0_8_ = (pointer)(local_dc8 + 0x10);
  std::__cxx11::string::_M_construct((ulong)local_dc8,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_dc8._0_8_,3,100);
  plVar13 = (long *)std::__cxx11::string::replace((ulong)local_dc8,0,(char *)0x0,0x123252);
  psVar16 = (size_type *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar16) {
    local_e08.field_2._M_allocated_capacity = *psVar16;
    local_e08.field_2._8_8_ = plVar13[3];
    local_e08._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_e08.field_2._M_allocated_capacity = *psVar16;
    local_e08._M_dataplus._M_p = (pointer)*plVar13;
  }
  local_e08._M_string_length = plVar13[1];
  *plVar13 = (long)psVar16;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_e08);
  psVar16 = puVar14 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar16) {
    local_e28.field_2._M_allocated_capacity = *psVar16;
    local_e28.field_2._8_8_ = puVar14[3];
    local_e28._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_e28.field_2._M_allocated_capacity = *psVar16;
    local_e28._M_dataplus._M_p = (pointer)*puVar14;
  }
  local_e28._M_string_length = puVar14[1];
  *puVar14 = psVar16;
  puVar14[1] = 0;
  *(undefined1 *)(puVar14 + 2) = 0;
  local_a78 = (undefined1  [8])((ulong)local_a78 & 0xffffffffffff0000);
  _Stack_a70._M_p = local_a68 + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&_Stack_a70,"max_iter","");
  in_08._M_len = 1;
  in_08._M_array = (iterator)local_a78;
  args::Matcher::Matcher((Matcher *)local_d08,in_08);
  local_d20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)local_858,&local_288.super_Group,
             (string *)local_d88,&local_e28,(Matcher *)local_d08,(int *)&local_d20,false);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(local_d08 + 0x38));
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_d08);
  if (_Stack_a70._M_p != local_a68 + 8) {
    operator_delete(_Stack_a70._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e28._M_dataplus._M_p != paVar1) {
    operator_delete(local_e28._M_dataplus._M_p);
  }
  argv_00 = local_de0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e08._M_dataplus._M_p != paVar2) {
    operator_delete(local_e08._M_dataplus._M_p);
  }
  if ((pointer)local_dc8._0_8_ != (pointer)(local_dc8 + 0x10)) {
    operator_delete((void *)local_dc8._0_8_);
  }
  if ((pointer)local_d88._0_8_ != pcVar5) {
    operator_delete((void *)local_d88._0_8_);
  }
  args::ArgumentParser::ParseCLI(&local_288,argc,argv_00);
  cVar10 = (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_358.super_ValueFlagBase.super_FlagBase.super_NamedBase.
                                super_Base._vptr_Base + 0x10))->_M_allocated_capacity)();
  iVar18 = 5;
  if (cVar10 != '\0') {
    iVar18 = local_358.value;
  }
  cVar10 = (**(code **)(local_428._0_8_ + 0x10))();
  iVar21 = 0x14;
  if (cVar10 != '\0') {
    iVar21 = local_360;
  }
  cVar10 = (**(code **)(local_768._0_8_ + 0x10))(local_768);
  local_de0 = (char **)(double)local_6a0;
  cVar11 = (**(code **)(local_5c8._0_8_ + 0x10))(local_5c8);
  local_d28 = (double)local_500;
  cVar12 = (**(code **)(local_b50._0_8_ + 0x10))();
  if (cVar12 == '\0') {
    uVar22 = 0;
    uVar23 = 0x3ff00000;
  }
  else {
    uVar22 = (undefined4)local_b10._136_8_;
    uVar23 = SUB84(local_b10._136_8_,4);
  }
  local_da0 = CONCAT44(uVar23,uVar22);
  cVar12 = (**(code **)(local_9a8._0_8_ + 0x10))();
  if (cVar12 != '\0') {
    local_d98 = local_8e0;
  }
  cVar12 = (**(code **)(local_4f8._0_8_ + 0x10))();
  if (cVar12 != '\0') {
    local_d90 = (double)local_430;
  }
  cVar12 = (**(code **)(local_858._0_8_ + 0x10))();
  iVar17 = 100;
  if (cVar12 != '\0') {
    iVar17 = local_790;
  }
  cVar12 = (**(code **)(local_698._0_8_ + 0x10))();
  local_e2c = 4;
  if (cVar12 != '\0') {
    local_e2c = local_5d0;
  }
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&local_e28,5,(allocator_type *)local_d08);
  local_e28._M_dataplus._M_p[0] = '\0';
  local_e28._M_dataplus._M_p[1] = '\0';
  local_e28._M_dataplus._M_p[2] = '\0';
  local_e28._M_dataplus._M_p[3] = '\0';
  std::__cxx11::string::_M_replace
            ((ulong)(local_e28._M_dataplus._M_p + 8),0,*(char **)(local_e28._M_dataplus._M_p + 0x10)
             ,0x123272);
  local_e28._M_dataplus._M_p[0x28] = 'F';
  local_e28._M_dataplus._M_p[0x29] = '\0';
  local_e28._M_dataplus._M_p[0x2a] = '\0';
  local_e28._M_dataplus._M_p[0x2b] = '\0';
  std::__cxx11::string::_M_replace
            ((ulong)(local_e28._M_dataplus._M_p + 0x30),0,
             *(char **)(local_e28._M_dataplus._M_p + 0x38),0x12329b);
  local_e28._M_dataplus._M_p[0x50] = -0x74;
  local_e28._M_dataplus._M_p[0x51] = '\0';
  local_e28._M_dataplus._M_p[0x52] = '\0';
  local_e28._M_dataplus._M_p[0x53] = '\0';
  std::__cxx11::string::_M_replace
            ((ulong)(local_e28._M_dataplus._M_p + 0x58),0,
             *(char **)(local_e28._M_dataplus._M_p + 0x60),0x1232c5);
  local_e28._M_dataplus._M_p[0x78] = -0x2e;
  local_e28._M_dataplus._M_p[0x79] = '\0';
  local_e28._M_dataplus._M_p[0x7a] = '\0';
  local_e28._M_dataplus._M_p[0x7b] = '\0';
  std::__cxx11::string::_M_replace
            ((ulong)(local_e28._M_dataplus._M_p + 0x80),0,
             *(char **)(local_e28._M_dataplus._M_p + 0x88),0x1232f0);
  local_e28._M_dataplus._M_p[0xa0] = '\x18';
  local_e28._M_dataplus._M_p[0xa1] = '\x01';
  local_e28._M_dataplus._M_p[0xa2] = '\0';
  local_e28._M_dataplus._M_p[0xa3] = '\0';
  std::__cxx11::string::_M_replace
            ((ulong)(local_e28._M_dataplus._M_p + 0xa8),0,
             *(char **)(local_e28._M_dataplus._M_p + 0xb0),0x12331b);
  local_e08._M_dataplus._M_p = (pointer)0x0;
  local_e08._M_string_length = 0;
  local_e08.field_2._M_allocated_capacity = 0;
  local_d08._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d08,"data/CERR_Prostate/DAO_DDM_BLADDER.dat","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d08);
  if ((pointer)local_d08._0_8_ != pcVar3) {
    operator_delete((void *)local_d08._0_8_);
  }
  local_d08._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d08,"data/CERR_Prostate/DAO_DDM_RECTUM.dat","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d08);
  if ((pointer)local_d08._0_8_ != pcVar3) {
    operator_delete((void *)local_d08._0_8_);
  }
  local_d08._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d08,"data/CERR_Prostate/DAO_DDM_PTVHD.dat","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d08);
  if ((pointer)local_d08._0_8_ != pcVar3) {
    operator_delete((void *)local_d08._0_8_);
  }
  local_dd4 = iVar17;
  local_dd0 = iVar21;
  local_dcc = iVar18;
  imrt::Collimator::Collimator
            ((Collimator *)local_d08,
             (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_e28);
  local_dc8._0_8_ = (pointer)0x0;
  local_dc8._8_8_ = (pointer)0x0;
  local_dc8._16_8_ = (pointer)0x0;
  if ((pointer)local_e08._M_string_length != local_e08._M_dataplus._M_p) {
    lVar19 = 8;
    uVar20 = 0;
    do {
      local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_788,*(long *)(local_e08._M_dataplus._M_p + lVar19 + -8),
                 *(long *)(local_e08._M_dataplus._M_p + lVar19) +
                 *(long *)(local_e08._M_dataplus._M_p + lVar19 + -8));
      imrt::Volume::Volume((Volume *)local_a78,(Collimator *)local_d08,&local_788);
      std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::emplace_back<imrt::Volume>
                ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)local_dc8,
                 (Volume *)local_a78);
      std::
      _Rb_tree<int,_std::pair<const_int,_maths::Matrix>,_std::_Select1st<std::pair<const_int,_maths::Matrix>_>,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_maths::Matrix>,_std::_Select1st<std::pair<const_int,_maths::Matrix>_>,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                   *)&_Stack_a70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_788._M_dataplus._M_p != &local_788.field_2) {
        operator_delete(local_788._M_dataplus._M_p);
      }
      uVar20 = uVar20 + 1;
      lVar19 = lVar19 + 0x20;
    } while (uVar20 < (ulong)((long)(local_e08._M_string_length - (long)local_e08._M_dataplus._M_p)
                             >> 5));
  }
  puVar15 = (undefined8 *)operator_new(0x28);
  puVar15[2] = 0;
  puVar15[3] = 0;
  *puVar15 = 0;
  puVar15[1] = 0;
  puVar15[4] = 0;
  lVar19 = 0;
  puVar14 = puVar15;
  do {
    this = (Station *)operator_new(0x170);
    imrt::Station::Station
              (this,(Collimator *)local_d08,
               (vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)local_dc8,(int)lVar19,
               local_e2c,0x1c,0,2,-1,6,(fstream *)0x0);
    imrt::Station::setUniformIntensity(this,local_d90);
    imrt::Station::printIntensity(this,false);
    *puVar14 = this;
    lVar19 = lVar19 + 0x46;
    puVar14 = puVar14 + 1;
  } while (lVar19 != 0x15e);
  ev = imrt::EvaluationFunction::getInstance
                 ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)local_dc8,
                  (Collimator *)local_d08);
  local_a78 = (undefined1  [8])0x3ff0000000000000;
  _Stack_a70._M_p = (pointer)0x3ff0000000000000;
  local_a68._0_8_ = 0x3ff0000000000000;
  __l._M_len = 3;
  __l._M_array = (iterator)local_a78;
  std::vector<double,_std::allocator<double>_>::vector(&local_d20,__l,(allocator_type *)local_d88);
  local_a78 = (undefined1  [8])0x0;
  _Stack_a70._M_p = (pointer)0x0;
  local_a68._0_8_ = 0x4053000000000000;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_a78;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_870,__l_00,(allocator_type *)local_d88);
  local_a78 = (undefined1  [8])0x4050400000000000;
  _Stack_a70._M_p = (pointer)0x404e000000000000;
  local_a68._0_8_ = 0x408f400000000000;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_a78;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_888,__l_01,(allocator_type *)local_d88);
  std::vector<double,_std::allocator<double>_>::vector(&local_8a0,&local_d20);
  std::vector<double,_std::allocator<double>_>::vector(&local_8b8,&local_870);
  std::vector<double,_std::allocator<double>_>::vector(&local_8d0,&local_888);
  imrt::Plan::Plan((Plan *)local_a78,ev,&local_8a0,&local_8b8,&local_8d0);
  if (local_8d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_8d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_8b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_8b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_8a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_8a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  lVar19 = 0;
  do {
    imrt::Plan::add_station((Plan *)local_a78,(Station *)puVar15[lVar19]);
    lVar19 = lVar19 + 1;
  } while (lVar19 != 5);
  local_d88._8_8_ = 100.0;
  iStack_d6c = local_dd0;
  iStack_d70 = local_dcc;
  local_d68 = 0;
  local_d88._0_8_ = &PTR__ILS_0012fcd0;
  local_d64 = 1;
  local_d58 = (double)local_de0;
  if (cVar10 == '\0') {
    local_d58 = 5.0;
  }
  uVar22 = SUB84(local_d28,0);
  uVar23 = (undefined4)((ulong)local_d28 >> 0x20);
  if (cVar11 == '\0') {
    uVar22 = 0;
    uVar23 = 0x40080000;
  }
  local_d50 = CONCAT44(uVar23,uVar22);
  local_d40 = CONCAT44(uVar23,uVar22);
  local_d38 = local_da0;
  local_d30 = local_d98;
  local_d48 = local_d58;
  imrt::ILS::beamTargetedSearch((ILS *)local_d88,(Plan *)local_a78,1000,local_dd4);
  system("python plotter/plot.py");
  imrt::Plan::~Plan((Plan *)local_a78);
  if (local_888.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_888.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_870.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_870.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((void *)CONCAT44(local_d20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       local_d20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_d20.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_d20.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  operator_delete(puVar15);
  std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::~vector
            ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)local_dc8);
  imrt::Collimator::~Collimator((Collimator *)local_d08);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_e08);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_e28);
  args::FlagBase::~FlagBase((FlagBase *)local_858);
  args::FlagBase::~FlagBase((FlagBase *)local_9a8);
  args::FlagBase::~FlagBase((FlagBase *)local_b50);
  args::FlagBase::~FlagBase((FlagBase *)local_5c8);
  args::FlagBase::~FlagBase((FlagBase *)local_768);
  args::FlagBase::~FlagBase((FlagBase *)local_698);
  args::FlagBase::~FlagBase((FlagBase *)local_4f8);
  args::FlagBase::~FlagBase((FlagBase *)local_428);
  args::FlagBase::~FlagBase((FlagBase *)&local_358);
  args::FlagBase::~FlagBase(&local_f8);
  args::ArgumentParser::~ArgumentParser(&local_288);
  return 0;
}

Assistant:

int main(int argc, char** argv){

  int vsize=20;
  int bsize=5;
  double int0=4.0;
  int maxiter=100;
  int max_apertures=4;
  double alpha=1.0;
  double beta=1.0;
  double maxdelta=5.0;
  double maxratio=3.0;

	args::ArgumentParser parser("********* IMRT-Solver (Intensity-aperture solver) *********", "Example:\n./IAS --max_iter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --max_ap=4");
	args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
	//args::ValueFlag<string> _format(parser, "string", "Format: (BR, BRw, 1C)", {'f'});
	args::ValueFlag<int> _bsize(parser, "int", "Number of considered beamlets for selection ("+to_string(bsize)+")", {"bsize"});
	args::ValueFlag<int> _vsize(parser, "int", "Number of considered worst voxels ("+to_string(vsize)+")", {"vsize"});
  args::ValueFlag<int> _int0(parser, "int", "Initial intensity for beams  ("+to_string(int0)+")", {"int0"});
  args::ValueFlag<int> _max_apertures(parser, "int", "Initial intensity for the station  ("+to_string(max_apertures)+")", {"max_ap"});
  args::ValueFlag<int> _maxdelta(parser, "int", "Max delta  ("+to_string(maxdelta)+")", {"maxdelta"});
  args::ValueFlag<int> _maxratio(parser, "int", "Max ratio  ("+to_string(maxratio)+")", {"maxratio"});
  args::ValueFlag<double> _alpha(parser, "double", "Initial temperature for intensities  ("+to_string(alpha)+")", {"alpha"});
  args::ValueFlag<double> _beta(parser, "double", "Initial temperature for ratio  ("+to_string(beta)+")", {"beta"});
  args::ValueFlag<int> _maxiter(parser, "int", "Number of iterations ("+to_string(maxiter)+")", {"max_iter"});

	//args::Flag trace(parser, "trace", "Trace", {"trace"});
	//args::Positional<std::string> _file(parser, "instance", "Instance");

	try
	{
		parser.ParseCLI(argc, argv);

	}
	catch (args::Help&)
	{
		std::cout << parser;
		return 0;
	}
	catch (args::ParseError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}
	catch (args::ValidationError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}

  if(_bsize) bsize=_bsize.Get();
  if(_vsize) vsize=_vsize.Get();
  if(_maxdelta) maxdelta=_maxdelta.Get();
  if(_maxratio) maxratio=_maxratio.Get();
  if(_alpha) alpha=_alpha.Get();
  if(_beta) beta=_beta.Get();
  if(_int0) int0=_int0.Get();
  if(_maxiter) maxiter=_maxiter.Get();
  if(_max_apertures) max_apertures=_max_apertures.Get();

	vector< pair<int, string> > coord_files(5);
	coord_files[0]=(make_pair(0,"data/CERR_Prostate/CoordinatesBeam_0.txt"));
	coord_files[1]=(make_pair(70,"data/CERR_Prostate/CoordinatesBeam_70.txt"));
	coord_files[2]=(make_pair(140,"data/CERR_Prostate/CoordinatesBeam_140.txt"));
	coord_files[3]=(make_pair(210,"data/CERR_Prostate/CoordinatesBeam_210.txt"));
	coord_files[4]=(make_pair(280,"data/CERR_Prostate/CoordinatesBeam_280.txt"));

	vector<string> organ_files;
	organ_files.push_back("data/CERR_Prostate/DAO_DDM_BLADDER.dat");
	organ_files.push_back("data/CERR_Prostate/DAO_DDM_RECTUM.dat");
	organ_files.push_back("data/CERR_Prostate/DAO_DDM_PTVHD.dat");

  	Collimator collimator(coord_files);
  //	collimator.printAxisValues();
  //	collimator.printActiveBeam();

	vector<Volume> volumes;

  for (int i=0; i<organ_files.size(); i++) {
	  volumes.push_back(Volume(collimator, organ_files[i]));
	}

   //volumes[0].print_deposition();

   vector<Station*> stations(5);
   Station* station;
   for(int i=0;i<5;i++){
	   station = new Station(collimator,volumes, i*70, max_apertures);
    station->setUniformIntensity(int0);
	   station->printIntensity();
	   stations[i]=station;
   }

   EvaluationFunction& F = EvaluationFunction::getInstance(volumes,collimator);
  // Plan P(F);

	vector<double> w={1,1,1};
	vector<double> Zmin={0,0,76};
	vector<double> Zmax={65,60,1000};

	Plan P(F, w, Zmin, Zmax);
	for(int i=0;i<5;i++)
	   P.add_station(*stations[i]);

	IntensityILS ils(1, bsize, vsize, maxdelta, maxratio, alpha, beta);
	ils.beamTargetedSearch(P,1000,maxiter);


   system("python plotter/plot.py");

	return 0;

}